

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enemy.cpp
# Opt level: O3

void __thiscall Enemy::setup(Enemy *this,Spritesheet *spritesheet)

{
  pointer *ppSVar1;
  pointer pSVar2;
  float fVar3;
  float fVar4;
  iterator iVar5;
  
  iVar5._M_current =
       this->animations[0].frames.
       super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (this->startPos).field_0 = (this->super_AABB).center.field_0;
  pSVar2 = (spritesheet->sprites).
           super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (iVar5._M_current ==
      this->animations[0].frames.super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<piksel::Sprite,std::allocator<piksel::Sprite>>::
    _M_realloc_insert<piksel::Sprite_const&>
              ((vector<piksel::Sprite,std::allocator<piksel::Sprite>> *)this->animations,iVar5,
               pSVar2 + 0x23);
    iVar5._M_current =
         this->animations[0].frames.
         super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>._M_impl.
         super__Vector_impl_data._M_finish;
  }
  else {
    fVar3 = pSVar2[0x23].sHeight;
    (iVar5._M_current)->sWidth = pSVar2[0x23].sWidth;
    (iVar5._M_current)->sHeight = fVar3;
    fVar3 = pSVar2[0x23].sx;
    fVar4 = pSVar2[0x23].sy;
    (iVar5._M_current)->img = pSVar2[0x23].img;
    (iVar5._M_current)->sx = fVar3;
    (iVar5._M_current)->sy = fVar4;
    iVar5._M_current =
         this->animations[0].frames.
         super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
    this->animations[0].frames.super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>.
    _M_impl.super__Vector_impl_data._M_finish = iVar5._M_current;
  }
  pSVar2 = (spritesheet->sprites).
           super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (iVar5._M_current ==
      this->animations[0].frames.super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<piksel::Sprite,std::allocator<piksel::Sprite>>::
    _M_realloc_insert<piksel::Sprite_const&>
              ((vector<piksel::Sprite,std::allocator<piksel::Sprite>> *)this->animations,iVar5,
               pSVar2 + 0x24);
  }
  else {
    fVar3 = pSVar2[0x24].sHeight;
    (iVar5._M_current)->sWidth = pSVar2[0x24].sWidth;
    (iVar5._M_current)->sHeight = fVar3;
    fVar3 = pSVar2[0x24].sx;
    fVar4 = pSVar2[0x24].sy;
    (iVar5._M_current)->img = pSVar2[0x24].img;
    (iVar5._M_current)->sx = fVar3;
    (iVar5._M_current)->sy = fVar4;
    ppSVar1 = &this->animations[0].frames.
               super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppSVar1 = *ppSVar1 + 1;
  }
  pSVar2 = (spritesheet->sprites).
           super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar5._M_current =
       this->animations[1].frames.
       super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar5._M_current !=
      this->animations[1].frames.super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    fVar3 = pSVar2[0x25].sHeight;
    (iVar5._M_current)->sWidth = pSVar2[0x25].sWidth;
    (iVar5._M_current)->sHeight = fVar3;
    fVar3 = pSVar2[0x25].sx;
    fVar4 = pSVar2[0x25].sy;
    (iVar5._M_current)->img = pSVar2[0x25].img;
    (iVar5._M_current)->sx = fVar3;
    (iVar5._M_current)->sy = fVar4;
    ppSVar1 = &this->animations[1].frames.
               super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppSVar1 = *ppSVar1 + 1;
    return;
  }
  std::vector<piksel::Sprite,std::allocator<piksel::Sprite>>::
  _M_realloc_insert<piksel::Sprite_const&>
            ((vector<piksel::Sprite,std::allocator<piksel::Sprite>> *)(this->animations + 1),iVar5,
             pSVar2 + 0x25);
  return;
}

Assistant:

void Enemy::setup(piksel::Spritesheet& spritesheet) {
    startPos = center;

    animations[WALKING].frames.push_back(spritesheet.sprites[35]);
    animations[WALKING].frames.push_back(spritesheet.sprites[36]);

    animations[DEAD].frames.push_back(spritesheet.sprites[37]);
}